

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,DiskLight *light,uint32_t indent,
          bool closing_brace)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pprint *ppVar2;
  string *psVar3;
  bool bVar4;
  ostream *poVar5;
  uint indent_00;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar6;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint indent_01;
  stringstream ss;
  string local_210;
  string local_1f0;
  uint32_t local_1cc;
  pprint *local_1c8;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1cc = indent;
  local_1c0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)light & 0xffffffff),n);
  poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  to_string_abi_cxx11_(&local_1f0,(tinyusdz *)(ulong)*(uint *)(this + 0x108),s);
  poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," DiskLight \"",0xc);
  poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,*(char **)(this + 0xe8),*(long *)(this + 0xf0));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
  paVar1 = &local_1f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  bVar4 = PrimMetas::authored((PrimMetas *)(this + 0x1d40));
  uVar6 = n_00;
  if (bVar4) {
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)light & 0xffffffff),n_00);
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    print_prim_metas_abi_cxx11_(&local_210,this + 0x1d40,(PrimMeta *)(ulong)((int)light + 1),indent)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    uVar6 = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_EDX_00;
    }
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)light & 0xffffffff),uVar6);
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
    uVar6 = extraout_EDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_EDX_02;
    }
  }
  pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)light & 0xffffffff),uVar6);
  poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"inputs:color","");
  indent_01 = (int)light + 1;
  local_1c8 = (pprint *)((ulong)light & 0xffffffff);
  print_typed_attr<tinyusdz::value::color3f>
            (&local_210,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
             (this + 0x850),&local_1f0,indent_01);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"inputs:colorTemperature","");
  print_typed_attr<float>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0xae8),
             &local_1f0,indent_01);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"inputs:diffuse","");
  print_typed_attr<float>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0xd70),
             &local_1f0,indent_01);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"inputs:enableColorTemperature","");
  print_typed_attr<bool>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)(this + 0xff8),
             &local_1f0,indent_01);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"inputs:exposure","");
  print_typed_attr<float>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x1280),
             &local_1f0,indent_01);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"inputs:intensity","");
  print_typed_attr<float>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x1508),
             &local_1f0,indent_01);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"inputs:normalize","");
  print_typed_attr<bool>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)(this + 0x1790),
             &local_1f0,indent_01);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"inputs:specular","");
  print_typed_attr<float>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x1a18),
             &local_1f0,indent_01);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"inputs:radius","");
  print_typed_attr<float>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x2168),
             &local_1f0,indent_01);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"extent","");
  print_typed_attr<tinyusdz::Extent>
            (&local_210,(TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)(this + 0x118),
             &local_1f0,indent_01);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"visibility","");
  print_typed_token_attr<tinyusdz::Visibility>
            (&local_210,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *)
             (this + 0x390),&local_1f0,indent_01);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"purpose","");
  indent_00 = indent_01;
  print_typed_token_attr<tinyusdz::Purpose>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Purpose> *)(this + 0x618),&local_1f0,
             indent_01);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  ppVar2 = local_1c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  print_xformOps_abi_cxx11_
            (&local_210,this,
             (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)(ulong)indent_01,
             indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  print_props(&local_210,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0x1d10),indent_01);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  uVar6 = extraout_EDX_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    uVar6 = extraout_EDX_04;
  }
  if ((char)local_1cc != '\0') {
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)ppVar2 & 0xffffffff),uVar6);
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
  }
  psVar3 = local_1c0;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string to_string(const DiskLight &light, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(light.spec) << " DiskLight \""
     << light.name << "\"\n";
  if (light.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(light.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  ss << print_typed_attr(light.color, "inputs:color", indent + 1);
  ss << print_typed_attr(light.colorTemperature, "inputs:colorTemperature",
                         indent + 1);
  ss << print_typed_attr(light.diffuse, "inputs:diffuse", indent + 1);
  ss << print_typed_attr(light.enableColorTemperature,
                         "inputs:enableColorTemperature", indent + 1);
  ss << print_typed_attr(light.exposure, "inputs:exposure", indent + 1);
  ss << print_typed_attr(light.intensity, "inputs:intensity", indent + 1);
  ss << print_typed_attr(light.normalize, "inputs:normalize", indent + 1);
  ss << print_typed_attr(light.specular, "inputs:specular", indent + 1);

  ss << print_typed_attr(light.radius, "inputs:radius", indent + 1);

  ss << print_typed_attr(light.extent, "extent", indent + 1);
  ss << print_typed_token_attr(light.visibility, "visibility", indent + 1);
  ss << print_typed_token_attr(light.purpose, "purpose", indent + 1);

  ss << print_xformOps(light.xformOps, indent + 1);
  ss << print_props(light.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}